

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void basic_suite::test_true(void)

{
  value local_64;
  value_type input [1];
  undefined4 local_5c;
  decoder decoder;
  
  input[0] = 0x81;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[1]>(&decoder,&input);
  local_64 = decoder.current.code;
  local_5c = 0x81;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::true_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x40,"void basic_suite::test_true()",&local_64,&local_5c);
  local_64 = trial::protocol::bintoken::token::symbol::convert(decoder.current.code);
  local_5c = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::boolean",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x41,"void basic_suite::test_true()",&local_64,&local_5c);
  local_64 = trial::protocol::bintoken::detail::decoder::category(&decoder);
  local_5c = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x42,"void basic_suite::test_true()",&local_64,&local_5c);
  trial::protocol::bintoken::detail::decoder::next(&decoder);
  local_64 = decoder.current.code;
  local_5c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x44,"void basic_suite::test_true()",&local_64,&local_5c);
  return;
}

Assistant:

void test_true()
{
    const value_type input[] = { token::code::true_value };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::true_value);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::boolean);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}